

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O1

void __thiscall w3Module::read_module(w3Module *this,PCSTR file_name)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  size_t in_RCX;
  uint8_t *puVar4;
  void *in_RDX;
  uint8_t *cursor;
  string local_40;
  
  w3MemoryMappedFile::read(&this->mmf,(int)file_name,in_RDX,in_RCX);
  this->base = (uint8_t *)(this->mmf).base;
  uVar3 = w3Fd::get_file_size(&(this->mmf).file,"");
  this->file_size = uVar3;
  this->end = this->base + uVar3;
  if (uVar3 < 8) {
    StringFormat_abi_cxx11_(&local_40,"too small %s",file_name);
    ThrowString(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  uVar1 = GetUint32LE(this->base);
  uVar2 = GetUint32LE(this->base + 4);
  printf("magic: %X\n",(ulong)uVar1);
  printf("version: %X\n",(ulong)uVar2);
  if (uVar1 != 0x6d736100) {
    StringFormat_abi_cxx11_(&local_40,"incorrect magic: %X",(ulong)uVar1);
    ThrowString(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if (uVar2 != 1) {
    StringFormat_abi_cxx11_(&local_40,"incorrect version: %X",(ulong)uVar2);
    ThrowString(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if (this->file_size != 8) {
    local_40._M_dataplus._M_p = (pointer)(this->base + 8);
    puVar4 = this->end;
    if (local_40._M_dataplus._M_p < puVar4) {
      do {
        read_section(this,(uint8_t **)&local_40);
        puVar4 = this->end;
      } while (local_40._M_dataplus._M_p < puVar4);
    }
    if ((uint8_t *)local_40._M_dataplus._M_p != puVar4) {
      AssertFailed("cursor == end");
    }
  }
  return;
}

Assistant:

void w3Module::read_module (PCSTR file_name)
{
    mmf.read (file_name);
    base = (uint8_t*)mmf.base;
    file_size = mmf.file.get_file_size ();
    end = file_size + (uint8_t*)base;

    if (file_size < 8)
        ThrowString (StringFormat ("too small %s", file_name));

    uint32_t magic = GetUint32LE(base);
    uint32_t version = GetUint32LE(base + 4);
    printf ("magic: %X\n", magic);
    printf ("version: %X\n", version);

    if (memcmp (&magic,"\0asm", 4))
        ThrowString (StringFormat ("incorrect magic: %X", magic));

    if (version != 1)
        ThrowString (StringFormat ("incorrect version: %X", (uint32_t)version));

    // Valid module with no sections.
    if (file_size == 8)
        return;

    uint8_t* cursor = base + 8;
    while (cursor < end)
        read_section (&cursor);

    Assert (cursor == end);
}